

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNTests.cpp
# Opt level: O3

void __thiscall IsNotNaNTests::ThenIsNotNanXIsNotFalse<float>(IsNotNaNTests *this,float value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  allocator local_2bd;
  float local_2bc;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong local_1d8 [2];
  code *local_1c8;
  code *local_1c0;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [14];
  ios_base local_130 [264];
  
  local_2bc = value;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Is::Not::NaN(","");
  std::__cxx11::string::string((string *)&local_218,_str + (*_str == '*'),&local_2bd);
  uVar5 = 0xf;
  if (local_1f8 != local_1e8) {
    uVar5 = local_1e8[0];
  }
  if (uVar5 < (ulong)(local_210 + local_1f0)) {
    uVar5 = 0xf;
    if (local_218 != local_208) {
      uVar5 = local_208[0];
    }
    if (uVar5 < (ulong)(local_210 + local_1f0)) goto LAB_001eb2fd;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f8);
  }
  else {
LAB_001eb2fd:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218);
  }
  local_298 = &local_288;
  puVar1 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar1) {
    local_288 = *puVar1;
    uStack_280 = puVar2[3];
  }
  else {
    local_288 = *puVar1;
    local_298 = (undefined8 *)*puVar2;
  }
  local_290 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_298);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar4) {
    local_248 = *puVar4;
    lStack_240 = plVar3[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *puVar4;
    local_258 = (ulong *)*plVar3;
  }
  local_250 = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::ostream::_M_insert<double>((double)local_2bc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  uVar5 = 0xf;
  if (local_258 != &local_248) {
    uVar5 = local_248;
  }
  if (uVar5 < (ulong)(local_230 + local_250)) {
    uVar5 = 0xf;
    if (local_238 != local_228) {
      uVar5 = local_228[0];
    }
    if (uVar5 < (ulong)(local_230 + local_250)) goto LAB_001eb473;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_001eb473:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_238);
  }
  local_2b8 = &local_2a8;
  puVar4 = puVar2 + 2;
  if ((ulong *)*puVar2 == puVar4) {
    local_2a8 = *puVar4;
    uStack_2a0 = *(undefined4 *)(puVar2 + 3);
    uStack_29c = *(undefined4 *)((long)puVar2 + 0x1c);
  }
  else {
    local_2a8 = *puVar4;
    local_2b8 = (ulong *)*puVar2;
  }
  local_2b0 = puVar2[1];
  *puVar2 = puVar4;
  puVar2[1] = 0;
  *(undefined1 *)puVar4 = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,") is Not False","");
  uVar5 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar5 = local_2a8;
  }
  if (uVar5 < (ulong)(local_1a8 + local_2b0)) {
    uVar5 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar5 = local_1a0[0];
    }
    if ((ulong)(local_1a8 + local_2b0) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_2b8);
      goto LAB_001eb55e;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1b0);
LAB_001eb55e:
  local_278 = &local_268;
  puVar1 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar1) {
    local_268 = *puVar1;
    uStack_260 = puVar2[3];
  }
  else {
    local_268 = *puVar1;
    local_278 = (undefined8 *)*puVar2;
  }
  local_270 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1d8[1] = 0;
  local_1d8[0] = (ulong)(uint)local_2bc;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:56:142)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:56:142)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,&local_278);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(local_1d8,local_1d8,3);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  return;
}

Assistant:

void ThenIsNotNanXIsNotFalse(T value)
	{
		Then(std::string("Is::Not::NaN(") + std::string(typeid(T).name()) + ": " + ut11::utility::ToString(value) + std::string(") is Not False"), [value]() {
			AssertThat(ut11::Is::Not::NaN(value), ut11::Is::Not::False);
		});
	}